

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BGIP_SolverBranchAndBound.h
# Opt level: O0

double __thiscall
BGIP_SolverBranchAndBound<JointPolicyPureVector>::ReSolve
          (BGIP_SolverBranchAndBound<JointPolicyPureVector> *this)

{
  bool bVar1;
  byte bVar2;
  ostream *poVar3;
  size_t sVar4;
  type pBVar5;
  size_type sVar6;
  long *in_RDI;
  double dVar7;
  BGIP_BnB_NodePtr top;
  BGIP_SolverBranchAndBound<JointPolicyPureVector> *in_stack_000000f0;
  Index i;
  E *e;
  LIndex nrJPols;
  shared_ptr<BGIP_BnB_Node> *in_stack_fffffffffffffea8;
  shared_ptr<BGIP_BnB_Node> *in_stack_fffffffffffffeb0;
  undefined1 *in_stack_fffffffffffffed8;
  undefined7 in_stack_fffffffffffffee0;
  byte in_stack_fffffffffffffee7;
  char *in_stack_fffffffffffffee8;
  undefined7 in_stack_fffffffffffffef0;
  byte in_stack_fffffffffffffef7;
  undefined1 local_b0 [16];
  char local_a0 [8];
  BGIP_BnB_NodePtr *in_stack_ffffffffffffff68;
  undefined4 in_stack_ffffffffffffff70;
  undefined4 in_stack_ffffffffffffff74;
  int iVar8;
  BGIP_BnB_NodePtr *in_stack_ffffffffffffff88;
  shared_count in_stack_ffffffffffffff90;
  allocator<char> local_61;
  string local_60 [36];
  uint local_3c;
  shared_ptr<const_BayesianGameIdenticalPayoffInterface> local_20;
  LIndex local_10;
  
  if (0 < (int)in_RDI[0x22]) {
    poVar3 = std::operator<<((ostream *)&std::cout,
                             "BGIP_SolverBranchAndBound starting BG Branch\'n\'Bound search now!");
    std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
    local_10 = 0;
    BayesianGameIdenticalPayoffSolver::GetBGIPI
              ((BayesianGameIdenticalPayoffSolver *)in_stack_fffffffffffffea8);
    boost::shared_ptr<const_BayesianGameIdenticalPayoffInterface>::operator->(&local_20);
    local_10 = BayesianGameBase::GetNrJointPolicies((BayesianGameBase *)0x160dec);
    boost::shared_ptr<const_BayesianGameIdenticalPayoffInterface>::~shared_ptr
              ((shared_ptr<const_BayesianGameIdenticalPayoffInterface> *)0x160e13);
    poVar3 = std::operator<<((ostream *)&std::cout,"BGIP_SolverBranchAndBound Solver Address: ");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,in_RDI);
    poVar3 = std::operator<<(poVar3,", nr BG JPols=");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,local_10);
    poVar3 = std::operator<<(poVar3,", CBG_LB=");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,(double)in_RDI[0x35]);
    std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
  }
  in_RDI[0x37] = -0x10000000000001;
  sVar4 = BayesianGameIdenticalPayoffSolver::GetNrFoundSolutions
                    ((BayesianGameIdenticalPayoffSolver *)0x160ef9);
  if (sVar4 != 0) {
    dVar7 = BayesianGameIdenticalPayoffSolver::GetPayoff
                      ((BayesianGameIdenticalPayoffSolver *)0x160f10);
    in_RDI[0x37] = (long)dVar7;
    if (0 < (int)in_RDI[0x22]) {
      poVar3 = std::operator<<((ostream *)&std::cout,
                               "Initialized max lower bound to value of best solution (out of ");
      sVar4 = BayesianGameIdenticalPayoffSolver::GetNrFoundSolutions
                        ((BayesianGameIdenticalPayoffSolver *)0x160f4e);
      poVar3 = (ostream *)std::ostream::operator<<(poVar3,sVar4);
      poVar3 = std::operator<<(poVar3," already found): ");
      poVar3 = (ostream *)std::ostream::operator<<(poVar3,(double)in_RDI[0x37]);
      std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
    }
  }
  local_3c = 0;
  while (bVar1 = std::
                 priority_queue<boost::shared_ptr<BGIP_BnB_Node>,_std::vector<boost::shared_ptr<BGIP_BnB_Node>,_std::allocator<boost::shared_ptr<BGIP_BnB_Node>_>_>,_std::less<boost::shared_ptr<BGIP_BnB_Node>_>_>
                 ::empty((priority_queue<boost::shared_ptr<BGIP_BnB_Node>,_std::vector<boost::shared_ptr<BGIP_BnB_Node>,_std::allocator<boost::shared_ptr<BGIP_BnB_Node>_>_>,_std::less<boost::shared_ptr<BGIP_BnB_Node>_>_>
                          *)0x160fb2), ((bVar1 ^ 0xffU) & 1) != 0) {
    local_3c = local_3c + 1;
    PrintStatistics(in_stack_000000f0,top.pn.pi_._4_4_);
    if (local_3c % 100 == 0) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT17(in_stack_fffffffffffffef7,in_stack_fffffffffffffef0),
                 in_stack_fffffffffffffee8,
                 (allocator<char> *)CONCAT17(in_stack_fffffffffffffee7,in_stack_fffffffffffffee0));
      (**(code **)(*in_RDI + 8))(in_RDI,local_60);
      std::__cxx11::string::~string(local_60);
      std::allocator<char>::~allocator(&local_61);
    }
    std::
    priority_queue<boost::shared_ptr<BGIP_BnB_Node>,_std::vector<boost::shared_ptr<BGIP_BnB_Node>,_std::allocator<boost::shared_ptr<BGIP_BnB_Node>_>_>,_std::less<boost::shared_ptr<BGIP_BnB_Node>_>_>
    ::top((priority_queue<boost::shared_ptr<BGIP_BnB_Node>,_std::vector<boost::shared_ptr<BGIP_BnB_Node>,_std::allocator<boost::shared_ptr<BGIP_BnB_Node>_>_>,_std::less<boost::shared_ptr<BGIP_BnB_Node>_>_>
           *)0x1610b7);
    boost::shared_ptr<BGIP_BnB_Node>::shared_ptr
              (in_stack_fffffffffffffeb0,in_stack_fffffffffffffea8);
    sVar4 = BayesianGameIdenticalPayoffSolver::GetNrDesiredSolutions
                      ((BayesianGameIdenticalPayoffSolver *)0x1610d4);
    if (sVar4 == 1) {
      pBVar5 = boost::shared_ptr<BGIP_BnB_Node>::operator->
                         ((shared_ptr<BGIP_BnB_Node> *)&stack0xffffffffffffff88);
      bVar2 = BGIP_BnB_Node::IsFullySpecifiedPolicy((uint)pBVar5);
      if ((bVar2 & 1) == 0) goto LAB_0016122c;
      pBVar5 = boost::shared_ptr<BGIP_BnB_Node>::operator->
                         ((shared_ptr<BGIP_BnB_Node> *)&stack0xffffffffffffff88);
      dVar7 = BGIP_BnB_Node::GetF(pBVar5);
      if (dVar7 <= (double)in_RDI[0x36] - 1e-12) goto LAB_0016122c;
      poVar3 = std::operator<<((ostream *)&std::cout,"Hit CBG upperbound");
      std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
      boost::shared_ptr<BGIP_BnB_Node>::shared_ptr
                (in_stack_fffffffffffffeb0,in_stack_fffffffffffffea8);
      ProcessFullySpecifiedNode
                ((BGIP_SolverBranchAndBound<JointPolicyPureVector> *)
                 CONCAT44(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70),
                 in_stack_ffffffffffffff68);
      boost::shared_ptr<BGIP_BnB_Node>::~shared_ptr((shared_ptr<BGIP_BnB_Node> *)0x1611c3);
      in_RDI[0x3a] = in_RDI[0x3a] + 1;
      iVar8 = 3;
    }
    else {
LAB_0016122c:
      pBVar5 = boost::shared_ptr<BGIP_BnB_Node>::operator->
                         ((shared_ptr<BGIP_BnB_Node> *)&stack0xffffffffffffff88);
      dVar7 = BGIP_BnB_Node::GetF(pBVar5);
      if (dVar7 < (double)in_RDI[0x37]) {
        pBVar5 = boost::shared_ptr<BGIP_BnB_Node>::operator->
                           ((shared_ptr<BGIP_BnB_Node> *)&stack0xffffffffffffff88);
        in_stack_fffffffffffffef7 = BGIP_BnB_Node::IsFullySpecifiedPolicy((uint)pBVar5);
        if ((in_stack_fffffffffffffef7 & 1) != 0) {
          in_stack_fffffffffffffee8 = local_a0;
          boost::shared_ptr<BGIP_BnB_Node>::shared_ptr
                    (in_stack_fffffffffffffeb0,in_stack_fffffffffffffea8);
          ProcessFullySpecifiedNode
                    ((BGIP_SolverBranchAndBound<JointPolicyPureVector> *)
                     CONCAT44(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70),
                     in_stack_ffffffffffffff68);
          boost::shared_ptr<BGIP_BnB_Node>::~shared_ptr((shared_ptr<BGIP_BnB_Node> *)0x1612d0);
          in_RDI[0x3a] = in_RDI[0x3a] + 1;
          iVar8 = 3;
          goto LAB_00161481;
        }
      }
      pBVar5 = boost::shared_ptr<BGIP_BnB_Node>::operator->
                         ((shared_ptr<BGIP_BnB_Node> *)&stack0xffffffffffffff88);
      in_stack_fffffffffffffee7 = BGIP_BnB_Node::IsFullySpecifiedPolicy((uint)pBVar5);
      if ((in_stack_fffffffffffffee7 & 1) == 0) {
        if (3 < (int)in_RDI[0x22]) {
          poVar3 = std::operator<<((ostream *)&std::cout,
                                   "BGIP_SolverBranchAndBound EXPANDING top node ");
          std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
        }
        boost::shared_ptr<BGIP_BnB_Node>::shared_ptr
                  (in_stack_fffffffffffffeb0,in_stack_fffffffffffffea8);
        ExpandAllExtensions((BGIP_SolverBranchAndBound<JointPolicyPureVector> *)
                            in_stack_ffffffffffffff90.pi_,in_stack_ffffffffffffff88);
        boost::shared_ptr<BGIP_BnB_Node>::~shared_ptr((shared_ptr<BGIP_BnB_Node> *)0x161451);
      }
      else {
        in_stack_fffffffffffffed8 = local_b0;
        boost::shared_ptr<BGIP_BnB_Node>::shared_ptr
                  (in_stack_fffffffffffffeb0,in_stack_fffffffffffffea8);
        ProcessFullySpecifiedNode
                  ((BGIP_SolverBranchAndBound<JointPolicyPureVector> *)
                   CONCAT44(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70),
                   in_stack_ffffffffffffff68);
        boost::shared_ptr<BGIP_BnB_Node>::~shared_ptr((shared_ptr<BGIP_BnB_Node> *)0x161391);
        in_RDI[0x3a] = in_RDI[0x3a] + 1;
      }
      iVar8 = 0;
    }
LAB_00161481:
    boost::shared_ptr<BGIP_BnB_Node>::~shared_ptr((shared_ptr<BGIP_BnB_Node> *)0x16148e);
    if (iVar8 != 0) break;
    in_stack_ffffffffffffff74 = 0;
  }
  if (0 < (int)in_RDI[0x22]) {
    poVar3 = std::operator<<((ostream *)&std::cout,"BGIP_SolverBranchAndBound Found ");
    sVar4 = BayesianGameIdenticalPayoffSolver::GetNrFoundSolutions
                      ((BayesianGameIdenticalPayoffSolver *)0x1614ed);
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,sVar4);
    poVar3 = std::operator<<(poVar3," solutions, after expanding ");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,in_RDI[0x38]);
    poVar3 = std::operator<<(poVar3," nodes (");
    dVar7 = GetPerJPRatio((BGIP_SolverBranchAndBound<JointPolicyPureVector> *)
                          CONCAT17(in_stack_fffffffffffffee7,in_stack_fffffffffffffee0),
                          (size_t)in_stack_fffffffffffffed8);
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,dVar7);
    poVar3 = std::operator<<(poVar3," pjp) - of which ");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,in_RDI[0x3a]);
    poVar3 = std::operator<<(poVar3," full (");
    dVar7 = GetPerJPRatio((BGIP_SolverBranchAndBound<JointPolicyPureVector> *)
                          CONCAT17(in_stack_fffffffffffffee7,in_stack_fffffffffffffee0),
                          (size_t)in_stack_fffffffffffffed8);
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,dVar7);
    poVar3 = std::operator<<(poVar3," pjp) - and pruning ");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,in_RDI[0x39]);
    poVar3 = std::operator<<(poVar3," of those");
    std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
    poVar3 = std::operator<<((ostream *)&std::cout,"BGIP_SolverBranchAndBound ");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,in_RDI);
    poVar3 = std::operator<<(poVar3," Open Queue size: ");
    sVar6 = std::
            priority_queue<boost::shared_ptr<BGIP_BnB_Node>,_std::vector<boost::shared_ptr<BGIP_BnB_Node>,_std::allocator<boost::shared_ptr<BGIP_BnB_Node>_>_>,_std::less<boost::shared_ptr<BGIP_BnB_Node>_>_>
            ::size((priority_queue<boost::shared_ptr<BGIP_BnB_Node>,_std::vector<boost::shared_ptr<BGIP_BnB_Node>,_std::allocator<boost::shared_ptr<BGIP_BnB_Node>_>_>,_std::less<boost::shared_ptr<BGIP_BnB_Node>_>_>
                    *)0x16163b);
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,sVar6);
    std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
  }
  dVar7 = BayesianGameIdenticalPayoffSolver::GetPayoff
                    ((BayesianGameIdenticalPayoffSolver *)0x161664);
  return dVar7;
}

Assistant:

double ReSolve()
    {
        if(_m_verbosity>=1)
        {
            std::cout << "BGIP_SolverBranchAndBound starting BG Branch'n'Bound search now!"<<std::endl;
            LIndex nrJPols=0;
            try{
                nrJPols = this->GetBGIPI()->GetNrJointPolicies();
            } catch(E& e)
            { ; }
            std::cout << "BGIP_SolverBranchAndBound Solver Address: "
                      << this << ", nr BG JPols=" << nrJPols
                      << ", CBG_LB=" << _m_CBGlowerBound << std::endl;
        }

        _m_maxLowerBound=-DBL_MAX;
#if INITIALIZE_LB_TO_BESTFOUND
        if(this->GetNrFoundSolutions()>0)
        {
            _m_maxLowerBound=this->GetPayoff();
            if(_m_verbosity>=1)
                std::cout << "Initialized max lower bound to value of best solution (out of "
                          << this->GetNrFoundSolutions() << " already found): "
                          << _m_maxLowerBound << std::endl;
        }
#endif

        Index i=0;
        // keep on expanding the open queue until it's empty
        while(!_m_openQueue->empty())
        {
            PrintStatistics(i++);

            if(i % 100 == 0)
                this->CheckDeadline("BnB deadline exceeded");

            BGIP_BnB_NodePtr top=_m_openQueue->top();
            

            if(this->GetNrDesiredSolutions()==1 &&
               top->IsFullySpecifiedPolicy(_m_maxDepth) &&
               top->GetF() > (_m_CBGupperBound-PROB_PRECISION))
            {
                std::cout << "Hit CBG upperbound" << std::endl;
                ProcessFullySpecifiedNode(top);
                _m_nrNodesFullySpecified++;
                break;
            }
#if BAILOUT_WHEN_CBG_LOWERBOUND_IS_HIT
            if(top->GetF() < _m_CBGlowerBound)
            {
                std::cout << "Hit CBG lowerbound, bailing out" << std::endl;
                return(-DBL_MAX);
            }
#endif
            if(top->GetF() < _m_maxLowerBound &&
               top->IsFullySpecifiedPolicy(_m_maxDepth)) // we still need to check
                                              // whether this is a fully
                                              // specified policy, there
                                              // can be multiple nodes
                                              // with the same
                                              // heuristic<LB, but not all
                                              // need to be complete
            {
                //We are done!!!
                //(max. upper bound < best found policy)
                
                //put the best policy on the solution
    //             ConvertNodeToPolicyAndAddToSolution(top, _m_maxLowerBound);
    //             PopAndDeleteNode(top);
                ProcessFullySpecifiedNode(top);
                _m_nrNodesFullySpecified++;
                //not really needed:
                //Prune(_m_maxLowerBound);
                break;
            }

            //for evaluation of the final policy, the expansion of nodes
            //and the computation of heuristic values  for the children we
            //will need to check whether actions are consistent. 
#if CACHE_IMPLIED_JPOL
            //(We cache the already specified actions in _m_impliedJPol)
            InitImpliedJPol();
#if DEBUG_VALID_ACTIONS 
            std::cout << "BGIP_SolverBranchAndBound implied jpol after initialization: " << 
                SoftPrintVector(_m_impliedJPol) << std::endl;
#endif                        
            top->GetImpliedJPol(_m_bgip, _m_jtIndexMapping, _m_impliedJPol);
#if DEBUG_VALID_ACTIONS 
            std::cout << "BGIP_SolverBranchAndBound implied jpol after GetImpliedJPol: " << 
                SoftPrintVector(_m_impliedJPol) << std::endl;
#endif                        
#endif // CACHE_IMPLIED_JPOL

            //else (if ! top->GetF() < _m_maxLowerBound )
            // check if node is fully specified
            if(top->IsFullySpecifiedPolicy(_m_maxDepth))
            {
                // updates _m_maxLowerBound and deletes the node
                ProcessFullySpecifiedNode(top);
                _m_nrNodesFullySpecified++;
            }
            else
            {
                if(_m_verbosity>3)
                    std::cout << "BGIP_SolverBranchAndBound EXPANDING top node "
                              <<std::endl;
                //top will be expanded
                //
#if INCR_EXPAND
                if(_m_expandAll)
                    ExpandAllExtensions(top);
                else
                    ExpandOneExtension(top);
#else                    
                ExpandAllExtensions(top);
#endif
            }
        }

        if(_m_verbosity>=1)
        {
            std::cout << "BGIP_SolverBranchAndBound Found "
                      << (this->
                          GetNrFoundSolutions())
                      << " solutions, after expanding "
                      << _m_nrNodesExpanded << " nodes ("
                      << GetPerJPRatio(_m_nrNodesExpanded) <<" pjp) - of which "
                      << _m_nrNodesFullySpecified << " full ("
                      << GetPerJPRatio(_m_nrNodesFullySpecified)
                      << " pjp) - and pruning "
                      << _m_nrNodesPruned << " of those"
                      << std::endl;
            std::cout << "BGIP_SolverBranchAndBound " << this
                      << " Open Queue size: " << _m_openQueue->size() << std::endl;
        }

        return(this->
               GetPayoff());
    }